

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint8_t * icu_63::expandGroupLengths(uint8_t *s,uint16_t *offsets,uint16_t *lengths)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  byte local_27;
  ushort local_26;
  uint16_t local_24;
  ushort local_22;
  uint8_t lengthByte;
  uint16_t length;
  uint16_t offset;
  ushort *puStack_20;
  uint16_t i;
  uint16_t *lengths_local;
  uint16_t *offsets_local;
  uint8_t *s_local;
  
  local_22 = 0;
  local_24 = 0;
  local_26 = 0;
  uVar1 = local_22;
  puVar4 = lengths;
  puVar3 = offsets;
  offsets_local = (uint16_t *)s;
  while (lengths_local = puVar3, puStack_20 = puVar4, local_22 = uVar1, local_22 < 0x20) {
    puVar2 = (uint16_t *)((long)offsets_local + 1);
    local_27 = (byte)*offsets_local;
    if (local_26 < 0xc) {
      if (local_27 < 0xc0) {
        local_26 = (ushort)((int)(uint)local_27 >> 4);
        local_27 = local_27 & 0xf;
      }
      else {
        local_26 = (local_27 & 0x3f) + 0xc;
      }
    }
    else {
      local_26 = ((local_26 & 3) << 4 | (ushort)((int)(uint)local_27 >> 4)) + 0xc;
      local_27 = local_27 & 0xf;
    }
    puVar3 = lengths_local + 1;
    *lengths_local = local_24;
    puVar4 = puStack_20 + 1;
    *puStack_20 = local_26;
    local_24 = local_24 + local_26;
    uVar1 = local_22 + 1;
    offsets_local = puVar2;
    if ((local_27 & 0xf0) == 0) {
      local_26 = (ushort)local_27;
      if (local_26 < 0xc) {
        *puVar3 = local_24;
        *puVar4 = local_26;
        local_24 = local_24 + local_26;
        uVar1 = local_22 + 2;
        puVar4 = puStack_20 + 2;
        puVar3 = lengths_local + 2;
      }
    }
    else {
      local_26 = 0;
    }
  }
  return (uint8_t *)offsets_local;
}

Assistant:

static const uint8_t *
expandGroupLengths(const uint8_t *s,
                   uint16_t offsets[LINES_PER_GROUP+1], uint16_t lengths[LINES_PER_GROUP+1]) {
    /* read the lengths of the 32 strings in this group and get each string's offset */
    uint16_t i=0, offset=0, length=0;
    uint8_t lengthByte;

    /* all 32 lengths must be read to get the offset of the first group string */
    while(i<LINES_PER_GROUP) {
        lengthByte=*s++;

        /* read even nibble - MSBs of lengthByte */
        if(length>=12) {
            /* double-nibble length spread across two bytes */
            length=(uint16_t)(((length&0x3)<<4|lengthByte>>4)+12);
            lengthByte&=0xf;
        } else if((lengthByte /* &0xf0 */)>=0xc0) {
            /* double-nibble length spread across this one byte */
            length=(uint16_t)((lengthByte&0x3f)+12);
        } else {
            /* single-nibble length in MSBs */
            length=(uint16_t)(lengthByte>>4);
            lengthByte&=0xf;
        }

        *offsets++=offset;
        *lengths++=length;

        offset+=length;
        ++i;

        /* read odd nibble - LSBs of lengthByte */
        if((lengthByte&0xf0)==0) {
            /* this nibble was not consumed for a double-nibble length above */
            length=lengthByte;
            if(length<12) {
                /* single-nibble length in LSBs */
                *offsets++=offset;
                *lengths++=length;

                offset+=length;
                ++i;
            }
        } else {
            length=0;   /* prevent double-nibble detection in the next iteration */
        }
    }

    /* now, s is at the first group string */
    return s;
}